

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

RandSeqProductionSymbol *
slang::ast::RandSeqProductionSymbol::findProduction
          (string_view name,SourceRange nameRange,ASTContext *context)

{
  SourceRange sourceRange;
  string_view arg;
  SourceLocation noteLocation;
  Symbol *pSVar1;
  Diagnostic *in_RCX;
  undefined8 in_RDX;
  Diagnostic *diag;
  Symbol *symbol;
  Scope *in_stack_00000278;
  bitmask<slang::ast::LookupFlags> in_stack_00000284;
  LookupLocation in_stack_00000288;
  string_view in_stack_00000298;
  SourceRange in_stack_000002c0;
  ASTContext *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  SourceLocation in_stack_ffffffffffffff50;
  SourceLocation in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar2;
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  RandSeqProductionSymbol *local_8;
  
  noteLocation = (SourceLocation)
                 not_null<const_slang::ast::Scope_*>::operator*
                           ((not_null<const_slang::ast::Scope_*> *)0x9159fc);
  ASTContext::getLocation(in_stack_ffffffffffffff30);
  bitmask<slang::ast::LookupFlags>::bitmask
            ((bitmask<slang::ast::LookupFlags> *)&stack0xffffffffffffff84,AllowDeclaredAfter);
  pSVar1 = Lookup::unqualifiedAt
                     (in_stack_00000278,in_stack_00000298,in_stack_00000288,in_stack_000002c0,
                      in_stack_00000284);
  if (pSVar1 == (Symbol *)0x0) {
    local_8 = (RandSeqProductionSymbol *)0x0;
  }
  else if (pSVar1->kind == RandSeqProduction) {
    local_8 = Symbol::as<slang::ast::RandSeqProductionSymbol>((Symbol *)0x915b9a);
  }
  else {
    uVar2 = 0x8e0006;
    sourceRange.endLoc = in_stack_ffffffffffffff58;
    sourceRange.startLoc = in_stack_ffffffffffffff50;
    ASTContext::addDiag((ASTContext *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                        SUB84((ulong)in_RDX >> 0x20,0),sourceRange);
    arg._M_str = in_stack_ffffffffffffff80;
    arg._M_len = in_stack_ffffffffffffff78;
    Diagnostic::operator<<((Diagnostic *)CONCAT44(uVar2,in_stack_ffffffffffffff70),arg);
    Diagnostic::addNote(in_RCX,SUB84(pSVar1->location,4),noteLocation);
    local_8 = (RandSeqProductionSymbol *)0x0;
  }
  return local_8;
}

Assistant:

const RandSeqProductionSymbol* RandSeqProductionSymbol::findProduction(std::string_view name,
                                                                       SourceRange nameRange,
                                                                       const ASTContext& context) {
    auto symbol = Lookup::unqualifiedAt(*context.scope, name, context.getLocation(), nameRange,
                                        LookupFlags::AllowDeclaredAfter);
    if (!symbol)
        return nullptr;

    if (symbol->kind != SymbolKind::RandSeqProduction) {
        auto& diag = context.addDiag(diag::NotAProduction, nameRange) << name;
        diag.addNote(diag::NoteDeclarationHere, symbol->location);
        return nullptr;
    }

    return &symbol->as<RandSeqProductionSymbol>();
}